

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::STEP::
InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_1UL,_0UL>::operator()
          (InternGenericConvertList<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_1UL,_0UL>
           *this,ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_1UL,_0UL> *out,
          shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *inp_base,DB *db)

{
  element_type *peVar1;
  pointer pLVar2;
  long lVar3;
  Logger *this_00;
  TypeError *this_01;
  long lVar4;
  ulong uVar5;
  InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_> local_71;
  undefined1 local_70 [64];
  
  peVar1 = (inp_base->
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(peVar1,&EXPRESS::DataType::typeinfo,&EXPRESS::LIST::typeinfo,0);
  }
  if (lVar3 != 0) {
    if (*(long *)(lVar3 + 0x10) == *(long *)(lVar3 + 8)) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"too few aggregate elements");
    }
    std::
    vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
    ::reserve(&out->
               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
              ,*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 4);
    if (*(long *)(lVar3 + 0x10) != *(long *)(lVar3 + 8)) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        local_70._0_8_ = (element_type *)0x0;
        std::
        vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>>>
        ::emplace_back<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>>
                  ((vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>>>
                    *)out,(Lazy<Assimp::IFC::Schema_2x3::IfcFace> *)local_70);
        pLVar2 = (out->
                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
                 ).
                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_70._0_8_ = *(undefined8 *)(*(long *)(lVar3 + 8) + -8 + lVar4);
        local_70._8_8_ = *(long *)(*(long *)(lVar3 + 8) + lVar4);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_)->_M_use_count + 1;
          }
        }
        InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFace>_>::operator()
                  (&local_71,pLVar2 + -1,
                   (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,db);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < (ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8) >> 4));
    }
    return;
  }
  this_01 = (TypeError *)__cxa_allocate_exception(0x10);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"type error reading aggregate","");
  TypeError::TypeError(this_01,(string *)local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this_01,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(ListOf<T, min_cnt, max_cnt>& out, const std::shared_ptr< const EXPRESS::DataType >& inp_base, const STEP::DB& db) {

            const EXPRESS::LIST* inp = dynamic_cast<const EXPRESS::LIST*>(inp_base.get());
            if (!inp) {
                throw TypeError("type error reading aggregate");
            }

            // XXX is this really how the EXPRESS notation ([?:3],[1:3]) is intended?
            if (max_cnt && inp->GetSize() > max_cnt) {
                ASSIMP_LOG_WARN("too many aggregate elements");
            }
            else if (inp->GetSize() < min_cnt) {
                ASSIMP_LOG_WARN("too few aggregate elements");
            }

            out.reserve(inp->GetSize());
            for(size_t i = 0; i < inp->GetSize(); ++i) {

                out.push_back( typename ListOf<T, min_cnt, max_cnt>::OutScalar() );
                try{
                    GenericConvert(out.back(),(*inp)[i], db);
                }
                catch(const TypeError& t) {
                    throw TypeError(t.what() +std::string(" of aggregate"));
                }
            }
        }